

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Window.cpp
# Opt level: O3

void __thiscall cursespp::Window::Blur(Window *this)

{
  if (focused != this) {
    return;
  }
  focused = (Window *)0x0;
  this->isDirty = true;
  (*(this->super_IWindow).super_IOrderable._vptr_IOrderable[0x34])(this,0);
  RepaintBackground(this);
  (*(this->super_IWindow).super_IOrderable._vptr_IOrderable[5])(this);
  return;
}

Assistant:

void Window::Blur() {
    ASSERT_MAIN_THREAD();

    if (::focused == this) {
        ::focused = nullptr;
        this->isDirty = true;
        this->OnFocusChanged(false);
        this->RepaintBackground();
        this->Redraw();
    }
}